

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O3

void __thiscall Board::Board(Board *this)

{
  undefined1 *local_40;
  undefined8 local_38;
  undefined1 local_30 [16];
  
  memset(this,0,0x90);
  (this->identifier)._M_dataplus._M_p = (pointer)&(this->identifier).field_2;
  (this->identifier)._M_string_length = 0;
  (this->identifier).field_2._M_local_buf[0] = '\0';
  (this->referrer)._M_dataplus._M_p = (pointer)&(this->referrer).field_2;
  (this->referrer)._M_string_length = 0;
  (this->referrer).field_2._M_local_buf[0] = '\0';
  (this->blocks).super__Vector_base<Block,_std::allocator<Block>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->blocks).super__Vector_base<Block,_std::allocator<Block>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->blocks).super__Vector_base<Block,_std::allocator<Block>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_38 = 0;
  local_30[0] = 0;
  local_40 = local_30;
  std::__cxx11::string::operator=((string *)&this->identifier,(string *)&local_40);
  if (local_40 != local_30) {
    operator_delete(local_40);
  }
  local_38 = 0;
  local_30[0] = 0;
  local_40 = local_30;
  std::__cxx11::string::operator=((string *)&this->referrer,(string *)&local_40);
  if (local_40 != local_30) {
    operator_delete(local_40);
  }
  return;
}

Assistant:

Board::Board() {
    this->identifier = string();
    this->referrer = string();
}